

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

bool __thiscall
mp::BasicSolver::ParseOptions
          (BasicSolver *this,char **argv,uint flags,ASLProblem *param_3,char *additional_options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  char **ppcVar8;
  path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  string exe_basename;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  this->has_errors_ = false;
  *(byte *)&this->bool_options_ = (byte)this->bool_options_ & 0xfe;
  this->option_flag_save_ = flags;
  if (additional_options != (char *)0x0) {
    ParseOptionString(this,additional_options,1);
    return false;
  }
  pcVar5 = getenv("mp_options");
  if (pcVar5 != (char *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"mp_options","");
    WarnOnDifferentCapitalizations(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    ParseOptionString(this,pcVar5,flags);
  }
  pcVar5 = (this->exe_path_)._M_dataplus._M_p;
  if (*pcVar5 != '\0') {
    local_70 = local_60;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar5 + sVar6);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_70,local_68 + (long)local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    path::filename((path *)&local_90,(path *)&local_b0);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    lVar7 = std::__cxx11::string::rfind((char)&local_70,0x2e);
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
      iVar4 = std::__cxx11::string::compare((char *)&local_90);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_90), iVar4 == 0)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70,local_68 + (long)local_70);
    std::__cxx11::string::append((char *)&local_90);
    _Var3._M_p = local_90._M_dataplus._M_p;
    pcVar5 = getenv(local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar1) {
      operator_delete(_Var3._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 != (char *)0x0) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_70,local_68 + (long)local_70);
      std::__cxx11::string::append((char *)&local_90);
      WarnOnDifferentCapitalizations(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      ParseOptionString(this,pcVar5,flags);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00348041;
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  paVar1 = &local_b0.field_2;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (this->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  _Var3._M_p = local_b0._M_dataplus._M_p;
  pcVar5 = getenv(local_b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar1) {
    operator_delete(_Var3._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 != (char *)0x0) {
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->name_)._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    WarnOnDifferentCapitalizations(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    ParseOptionString(this,pcVar5,flags);
  }
LAB_00348041:
  if ((argv != (char **)0x0) && (pcVar5 = *argv, pcVar5 != (char *)0x0)) {
    ppcVar8 = argv + 1;
    do {
      ParseOptionString(this,pcVar5,flags | 2);
      pcVar5 = *ppcVar8;
      ppcVar8 = ppcVar8 + 1;
    } while (pcVar5 != (char *)0x0);
  }
  if ((this->bool_options_ & 1) != 0) {
    ShowVersion(this);
  }
  return (bool)(this->has_errors_ ^ 1);
}

Assistant:

bool BasicSolver::ParseOptions(char **argv, unsigned flags, const ASLProblem *, char* additional_options) {
  has_errors_ = false;
  bool_options_ &= ~SHOW_VERSION;
  option_flag_save_ = flags;
  // 0. If additional options are specified, parse only those
  if (additional_options) {
    ParseOptionString(additional_options, NO_OPTION_ECHO);
    return false;
  }
  
  // 1. Try & parse 'mp_options'
  if (const char *s = std::getenv("mp_options")) {
    WarnOnDifferentCapitalizations("mp_options");
    ParseOptionString(s, flags);
  }
  bool had_exe_name_option_var = false;
  // 2. Try the '<solver_exe>_options' env var.
  const char *s = exe_path();
  if (std::strlen(s)) {
    path p(s);
    auto exe_basename = p.filename().string();
    auto pt = exe_basename.rfind('.');
    if (std::string::npos != pt) {
      auto ext = exe_basename.substr(pt);
      if (".exe"==ext || ".app"==ext)
        exe_basename = exe_basename.substr(0, pt);
    }
    if (const char *s
        = std::getenv((exe_basename + "_options").c_str())) {
      WarnOnDifferentCapitalizations(exe_basename + "_options");
      ParseOptionString(s, flags);
      had_exe_name_option_var = true;
    }
  }
  // 3. If no exe-name-specific options,
  // try '<solver_std_name>_options', such as 'gurobi_options'
  if (!had_exe_name_option_var)
  if (const char *s = std::getenv((name_ + "_options").c_str())) {
    WarnOnDifferentCapitalizations(name_ + "_options");
    ParseOptionString(s, flags);
  }
  // 4. Proceed to command-line options
  flags |= FROM_COMMAND_LINE;
  if (argv) {
    while (const char *s = *argv++) {
      ParseOptionString(s, flags);
    }
  }
  
  if ((bool_options_ & SHOW_VERSION) != 0)
    ShowVersion();
  return !has_errors_;
}